

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O3

void __thiscall
fill<16U,_2U,_buffer_layout_bfs>::operator()
          (fill<16U,_2U,_buffer_layout_bfs> *this,array<Stream,_16UL> *streams,uchar **buffer,
          array<unsigned_long,_16UL> *buffer_count)

{
  uchar *__s1;
  long lVar1;
  unsigned_long *puVar2;
  int iVar3;
  unsigned_long *puVar4;
  long lVar5;
  unsigned_long uVar6;
  uchar *__s2;
  uchar **from0;
  unsigned_long uVar7;
  long lVar8;
  size_t __n;
  size_t n0;
  fill<16U,_4U,_buffer_layout_bfs> local_54;
  fill<16U,_5U,_buffer_layout_bfs> local_53;
  fill<16U,_5U,_buffer_layout_bfs> local_52;
  fill<16U,_4U,_buffer_layout_bfs> local_51;
  array<Stream,_16UL> *local_50;
  unsigned_long *local_48;
  unsigned_long *local_40;
  long local_38;
  
  puVar4 = buffer_count->_M_elems + 4;
  local_48 = buffer_count->_M_elems + 5;
  lVar8 = 0;
  n0 = 0;
  local_50 = streams;
  local_40 = puVar4;
  do {
    uVar6 = *puVar4;
    if (uVar6 == 0) {
      fill<16U,_4U,_buffer_layout_bfs>::operator()(&local_51,local_50,buffer,buffer_count);
      uVar6 = buffer_count->_M_elems[4];
      if (uVar6 == 0) {
        uVar6 = *local_48;
        lVar8 = -0x40 - lVar8;
        lVar5 = 8 - n0;
        break;
      }
    }
    uVar7 = *local_48;
    local_38 = lVar8;
    if (uVar7 == 0) {
      fill<16U,_5U,_buffer_layout_bfs>::operator()(&local_52,local_50,buffer,buffer_count);
      uVar6 = buffer_count->_M_elems[4];
      uVar7 = buffer_count->_M_elems[5];
      if (uVar7 == 0) {
        __n = -local_38;
        lVar8 = -n0;
        goto LAB_00128b5e;
      }
    }
    __s1 = buffer[0x50 - uVar6];
    if (__s1 == (uchar *)0x0) {
      __assert_fail("a != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x5c,"int cmp(const unsigned char *, const unsigned char *)");
    }
    __s2 = buffer[0x90 - uVar7];
    if (__s2 == (uchar *)0x0) {
      __assert_fail("b != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x5d,"int cmp(const unsigned char *, const unsigned char *)");
    }
    iVar3 = strcmp((char *)__s1,(char *)__s2);
    puVar4 = local_40;
    puVar2 = local_48;
    if (iVar3 < 1) {
      __s2 = __s1;
      puVar2 = local_40;
      uVar7 = uVar6;
    }
    *puVar2 = uVar7 - 1;
    buffer[n0] = __s2;
    check_input(buffer,n0);
    n0 = n0 + 1;
    lVar8 = local_38 + -8;
    if (n0 == 8) {
      buffer_count->_M_elems[2] = 8;
      return;
    }
  } while( true );
  do {
    if (uVar6 == 0) {
      fill<16U,_5U,_buffer_layout_bfs>::operator()(&local_53,local_50,buffer,buffer_count);
      uVar6 = buffer_count->_M_elems[5];
      if (uVar6 == 0) {
        lVar1 = -lVar8;
        __n = lVar8 + 0x40;
        goto LAB_00128bf2;
      }
    }
    buffer[n0] = buffer[0x90 - uVar6];
    uVar6 = uVar6 - 1;
    *local_48 = uVar6;
    lVar5 = lVar5 + -1;
    n0 = n0 + 1;
    lVar8 = lVar8 + 8;
  } while (lVar8 != 0);
  goto LAB_00128bb0;
LAB_00128b5e:
  do {
    if (uVar6 == 0) {
      fill<16U,_4U,_buffer_layout_bfs>::operator()(&local_54,local_50,buffer,buffer_count);
      uVar6 = buffer_count->_M_elems[4];
      if (uVar6 == 0) {
        lVar1 = 0x40 - __n;
        lVar5 = lVar8 + 8;
        n0 = -lVar8;
LAB_00128bf2:
        from0 = (uchar **)((long)buffer + lVar1);
        memmove(buffer + lVar5,buffer,__n);
        buffer_count->_M_elems[2] = n0;
        goto LAB_00128c06;
      }
    }
    *(uchar **)((long)buffer + __n) = buffer[0x50 - uVar6];
    uVar6 = uVar6 - 1;
    *local_40 = uVar6;
    lVar8 = lVar8 + -1;
    __n = __n + 8;
  } while (__n != 0x40);
LAB_00128bb0:
  buffer_count->_M_elems[2] = 8;
  n0 = 8;
  from0 = buffer;
LAB_00128c06:
  check_input(from0,n0);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}